

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

bool google::protobuf::internal::WireFormat::ParseAndMergePartial
               (CodedInputStream *input,Message *message)

{
  byte *pbVar1;
  bool bVar2;
  byte bVar3;
  uint32_t first_byte_or_zero;
  Descriptor *this;
  FieldDescriptor *field;
  ExtensionRange *pEVar4;
  uint number;
  byte unaff_BPL;
  Metadata MVar5;
  
  MVar5 = Message::GetMetadata(message);
  this = MVar5.descriptor;
  MVar5 = Message::GetMetadata(message);
  do {
    pbVar1 = input->buffer_;
    first_byte_or_zero = 0;
    if ((pbVar1 < input->buffer_end_) &&
       (first_byte_or_zero = (uint32_t)*pbVar1, -1 < (char)*pbVar1)) {
      input->buffer_ = pbVar1 + 1;
    }
    else {
      first_byte_or_zero = io::CodedInputStream::ReadTagFallback(input,first_byte_or_zero);
    }
    input->last_tag_ = first_byte_or_zero;
    if ((first_byte_or_zero & 7) == 4 || first_byte_or_zero == 0) {
      unaff_BPL = 1;
      bVar3 = 1;
    }
    else {
      if (this == (Descriptor *)0x0) {
        field = (FieldDescriptor *)0x0;
      }
      else {
        number = first_byte_or_zero >> 3;
        field = Descriptor::FindFieldByNumber(this,number);
        if (field == (FieldDescriptor *)0x0) {
          pEVar4 = Descriptor::FindExtensionRangeContainingNumber(this,number);
          if (pEVar4 == (ExtensionRange *)0x0) {
            field = (FieldDescriptor *)0x0;
          }
          else if (input->extension_pool_ == (DescriptorPool *)0x0) {
            field = Reflection::FindKnownExtensionByNumber(MVar5.reflection,number);
          }
          else {
            field = DescriptorPool::FindExtensionByNumber(input->extension_pool_,this,number);
          }
        }
        bVar2 = true;
        bVar3 = 0;
        if (((field == (FieldDescriptor *)0x0) && (bVar3 = 0, first_byte_or_zero == 0xb)) &&
           ((this->options_->field_0)._impl_.message_set_wire_format_ != false)) {
          bVar2 = ParseAndMergeMessageSetItem(input,message);
          bVar3 = bVar2 + 1;
          unaff_BPL = bVar2 & unaff_BPL;
          bVar2 = false;
        }
        if (!bVar2) goto LAB_002de7c4;
      }
      bVar2 = ParseAndMergeField(first_byte_or_zero,field,message,input);
      unaff_BPL = unaff_BPL & bVar2;
      bVar3 = !bVar2;
    }
LAB_002de7c4:
    if ((bVar3 & 1) != 0) {
      return (bool)(unaff_BPL & 1);
    }
  } while( true );
}

Assistant:

bool WireFormat::ParseAndMergePartial(io::CodedInputStream* input,
                                      Message* message) {
  const Descriptor* descriptor = message->GetDescriptor();
  const Reflection* message_reflection = message->GetReflection();

  while (true) {
    uint32_t tag = input->ReadTag();
    if (tag == 0) {
      // End of input.  This is a valid place to end, so return true.
      return true;
    }

    if (WireFormatLite::GetTagWireType(tag) ==
        WireFormatLite::WIRETYPE_END_GROUP) {
      // Must be the end of the message.
      return true;
    }

    const FieldDescriptor* field = nullptr;

    if (descriptor != nullptr) {
      int field_number = WireFormatLite::GetTagFieldNumber(tag);
      field = descriptor->FindFieldByNumber(field_number);

      // If that failed, check if the field is an extension.
      if (field == nullptr && descriptor->IsExtensionNumber(field_number)) {
        if (input->GetExtensionPool() == nullptr) {
          field = message_reflection->FindKnownExtensionByNumber(field_number);
        } else {
          field = input->GetExtensionPool()->FindExtensionByNumber(
              descriptor, field_number);
        }
      }

      // If that failed, but we're a MessageSet, and this is the tag for a
      // MessageSet item, then parse that.
      if (field == nullptr && descriptor->options().message_set_wire_format() &&
          tag == WireFormatLite::kMessageSetItemStartTag) {
        if (!ParseAndMergeMessageSetItem(input, message)) {
          return false;
        }
        continue;  // Skip ParseAndMergeField(); already taken care of.
      }
    }

    if (!ParseAndMergeField(tag, field, message, input)) {
      return false;
    }
  }
}